

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_psllw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  byte bVar1;
  int shift;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  if (s->_q_MMXReg[0] < 0x10) {
    bVar1 = s->_b_MMXReg[0];
    d->_w_MMXReg[0] = d->_w_MMXReg[0] << (bVar1 & 0x1f);
    d->_w_MMXReg[1] = d->_w_MMXReg[1] << (bVar1 & 0x1f);
    d->_w_MMXReg[2] = d->_w_MMXReg[2] << (bVar1 & 0x1f);
    d->_w_MMXReg[3] = d->_w_MMXReg[3] << (bVar1 & 0x1f);
  }
  else {
    d->_q_MMXReg[0] = 0;
  }
  return;
}

Assistant:

void glue(helper_psllw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->W(0) <<= shift;
        d->W(1) <<= shift;
        d->W(2) <<= shift;
        d->W(3) <<= shift;
#if SHIFT == 1
        d->W(4) <<= shift;
        d->W(5) <<= shift;
        d->W(6) <<= shift;
        d->W(7) <<= shift;
#endif
    }
}